

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExtractor_impl.hpp
# Opt level: O2

void __thiscall
hiberlite::ExtractModel::
act<hiberlite::AVisitor<hiberlite::ExtractModel>,std::pair<int,double>,hiberlite::stl_stream_adapter<std::pair<int,double>,std::set<std::pair<int,double>,std::less<std::pair<int,double>>,std::allocator<std::pair<int,double>>>>>
          (ExtractModel *this,AVisitor<hiberlite::ExtractModel> *av,
          collection_nvp<std::pair<int,_double>,_hiberlite::stl_stream_adapter<std::pair<int,_double>,_std::set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>_>_>
          *nvp)

{
  pair<int,_double> *_value;
  pair<int,_double> *entry;
  sql_nvp<std::pair<int,_double>_> el;
  allocator local_1da;
  allocator local_1d9;
  pair<int,_double> *local_1d8;
  Scope local_1d0;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  sql_nvp<std::pair<int,_double>_> local_68;
  
  access::construct<hiberlite::AVisitor<hiberlite::ExtractModel>,std::pair<int,double>>
            (av,&local_1d8);
  std::__cxx11::string::string((string *)&local_88,(string *)nvp);
  AVisitor<hiberlite::ExtractModel>::diveTable(av,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  Scope::Scope(&local_1d0,&av->scope);
  std::__cxx11::string::string((string *)&local_a8,(string *)&local_1d0);
  std::__cxx11::string::string((string *)&local_c8,"hiberlite_parent_id",&local_1d9);
  std::__cxx11::string::string((string *)&local_e8,"INTEGER",&local_1da);
  putNamedColumn(this,&local_a8,&local_c8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  Scope::~Scope(&local_1d0);
  Scope::Scope(&local_1d0,&av->scope);
  std::__cxx11::string::string((string *)&local_108,(string *)&local_1d0);
  std::__cxx11::string::string((string *)&local_128,"hiberlite_entry_indx",&local_1d9);
  std::__cxx11::string::string((string *)&local_148,"INTEGER",&local_1da);
  putNamedColumn(this,&local_108,&local_128,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  Scope::~Scope(&local_1d0);
  std::__cxx11::string::string((string *)&local_168,"item",&local_1d9);
  _value = local_1d8;
  std::__cxx11::string::string((string *)&local_188,"",&local_1da);
  sql_nvp<std::pair<int,_double>_>::sql_nvp
            ((sql_nvp<std::pair<int,_double>_> *)&local_1d0,&local_168,_value,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_168);
  sql_nvp<std::pair<int,_double>_>::sql_nvp
            (&local_68,(sql_nvp<std::pair<int,_double>_> *)&local_1d0);
  AVisitor<hiberlite::ExtractModel>::operator&(av,&local_68);
  sql_nvp<std::pair<int,_double>_>::~sql_nvp(&local_68);
  AVisitor<hiberlite::ExtractModel>::popScope(av);
  operator_delete(local_1d8);
  sql_nvp<std::pair<int,_double>_>::~sql_nvp((sql_nvp<std::pair<int,_double>_> *)&local_1d0);
  return;
}

Assistant:

void ExtractModel::act(AV& av, collection_nvp<E,S> nvp )
{
	E* entry;
	construct(av, &entry, static_cast<unsigned int>(0));
		av.diveTable(nvp.name);

			putNamedColumn(av.getScope().table(), HIBERLITE_PARENTID_COLUMN, HIBERLITE_ID_STORAGE_CLASS);
			putNamedColumn(av.getScope().table(), HIBERLITE_ENTRY_INDEX_COLUMN, HIBERLITE_ID_STORAGE_CLASS);

			sql_nvp<E> el("item",*entry);
			av & el;
		av.pop();
	destroy(*this, entry, static_cast<unsigned int>(0));
}